

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::PrintEnvironment(Benchmark *this)

{
  Slice s;
  bool bVar1;
  char *pcVar2;
  FILE *pFVar3;
  char *pcVar4;
  uint uVar5;
  string *this_00;
  Slice SVar6;
  Slice val;
  Slice key;
  string local_480;
  string cache_size;
  string cpu_type;
  time_t now;
  char line [1000];
  
  uVar5 = 0;
  fprintf(_stderr,"LevelDB:    version %d.%d\n",1,0x16);
  now = time((time_t *)0x0);
  pFVar3 = _stderr;
  pcVar2 = ctime(&now);
  fprintf(pFVar3,"Date:       %s",pcVar2);
  pFVar3 = fopen("/proc/cpuinfo","r");
  if (pFVar3 == (FILE *)0x0) {
    return;
  }
  cpu_type._M_dataplus._M_p = (pointer)&cpu_type.field_2;
  cpu_type._M_string_length = 0;
  cpu_type.field_2._M_local_buf[0] = '\0';
  cache_size._M_dataplus._M_p = (pointer)&cache_size.field_2;
  cache_size._M_string_length = 0;
  cache_size.field_2._M_local_buf[0] = '\0';
  pcVar2 = (char *)~(ulong)line;
LAB_00109f24:
  do {
    pcVar4 = fgets(line,1000,pFVar3);
    if (pcVar4 == (char *)0x0) {
      fclose(pFVar3);
      fprintf(_stderr,"CPU:        %d * %s\n",(ulong)uVar5,cpu_type._M_dataplus._M_p);
      fprintf(_stderr,"CPUCache:   %s\n",cache_size._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&cache_size);
      std::__cxx11::string::~string((string *)&cpu_type);
      return;
    }
    pcVar4 = strchr(line,0x3a);
  } while (pcVar4 == (char *)0x0);
  SVar6.size_ = (size_t)val.data_;
  SVar6.data_ = pcVar2;
  key = anon_unknown_0::TrimSpace(SVar6);
  strlen(pcVar4 + 1);
  s.size_ = (size_t)val.data_;
  s.data_ = pcVar2;
  SVar6 = anon_unknown_0::TrimSpace(s);
  val.data_ = SVar6.data_;
  val.size_ = SVar6.size_;
  local_480._M_dataplus._M_p = "model name";
  local_480._M_string_length = 10;
  bVar1 = operator==(&key,(Slice *)&local_480);
  if (!bVar1) goto LAB_00109fc8;
  Slice::ToString_abi_cxx11_(&local_480,&val);
  uVar5 = uVar5 + 1;
  this_00 = &cpu_type;
  goto LAB_0010a002;
LAB_00109fc8:
  local_480._M_dataplus._M_p = "cache size";
  local_480._M_string_length = 10;
  bVar1 = operator==(&key,(Slice *)&local_480);
  if (bVar1) {
    Slice::ToString_abi_cxx11_(&local_480,&val);
    this_00 = &cache_size;
LAB_0010a002:
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_480);
  }
  goto LAB_00109f24;
}

Assistant:

void PrintEnvironment() {
    fprintf(stderr, "LevelDB:    version %d.%d\n", kMajorVersion,
            kMinorVersion);

#if defined(__linux)
    time_t now = time(nullptr);
    fprintf(stderr, "Date:       %s", ctime(&now));  // ctime() adds newline

    FILE* cpuinfo = fopen("/proc/cpuinfo", "r");
    if (cpuinfo != nullptr) {
      char line[1000];
      int num_cpus = 0;
      std::string cpu_type;
      std::string cache_size;
      while (fgets(line, sizeof(line), cpuinfo) != nullptr) {
        const char* sep = strchr(line, ':');
        if (sep == nullptr) {
          continue;
        }
        Slice key = TrimSpace(Slice(line, sep - 1 - line));
        Slice val = TrimSpace(Slice(sep + 1));
        if (key == "model name") {
          ++num_cpus;
          cpu_type = val.ToString();
        } else if (key == "cache size") {
          cache_size = val.ToString();
        }
      }
      fclose(cpuinfo);
      fprintf(stderr, "CPU:        %d * %s\n", num_cpus, cpu_type.c_str());
      fprintf(stderr, "CPUCache:   %s\n", cache_size.c_str());
    }
#endif
  }